

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O0

int ptls_openssl_decrypt_ticket
              (ptls_buffer_t *buf,ptls_iovec_t src,
              _func_int_uchar_ptr_uchar_ptr_EVP_CIPHER_CTX_ptr_HMAC_CTX_ptr_int *cb)

{
  int iVar1;
  size_t sVar2;
  code *in_RCX;
  size_t in_RDX;
  uchar *in_RSI;
  long *in_RDI;
  uint8_t hmac [64];
  size_t hmac_size;
  int ret;
  int clen;
  HMAC_CTX *hctx;
  EVP_CIPHER_CTX *cctx;
  uchar auStackY_88 [8];
  size_t in_stack_ffffffffffffff80;
  ptls_buffer_t *in_stack_ffffffffffffff88;
  int local_38;
  int local_34;
  HMAC_CTX *local_30;
  EVP_CIPHER_CTX *local_28;
  code *local_20;
  long *local_18;
  uchar *local_10;
  size_t local_8;
  
  local_28 = (EVP_CIPHER_CTX *)0x0;
  local_30 = (HMAC_CTX *)0x0;
  local_20 = in_RCX;
  local_18 = in_RDI;
  local_10 = in_RSI;
  local_8 = in_RDX;
  local_28 = EVP_CIPHER_CTX_new();
  if (local_28 == (EVP_CIPHER_CTX *)0x0) {
    local_38 = 0x201;
  }
  else {
    local_30 = (HMAC_CTX *)HMAC_CTX_new();
    if (local_30 == (HMAC_CTX *)0x0) {
      local_38 = 0x201;
    }
    else if (local_8 < 0x20) {
      local_38 = 0x32;
    }
    else {
      iVar1 = (*local_20)(local_10,local_10 + 0x10,local_28,local_30,0);
      if (iVar1 == 0) {
        local_38 = 0x203;
      }
      else {
        sVar2 = HMAC_size(local_30);
        if (local_8 < sVar2 + 0x20) {
          local_38 = 0x32;
        }
        else {
          local_8 = local_8 - sVar2;
          iVar1 = HMAC_Update(local_30,local_10,local_8);
          if ((iVar1 == 0) || (iVar1 = HMAC_Final(local_30,auStackY_88,(uint *)0x0), iVar1 == 0)) {
            local_38 = 0x203;
          }
          else {
            iVar1 = (*ptls_mem_equal)(local_10 + local_8,auStackY_88,sVar2);
            if (iVar1 == 0) {
              local_38 = 0x28;
            }
            else {
              local_10 = local_10 + 0x20;
              local_8 = local_8 - 0x20;
              local_38 = ptls_buffer_reserve(in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
              if (local_38 == 0) {
                iVar1 = EVP_DecryptUpdate(local_28,(uchar *)(*local_18 + local_18[2]),&local_34,
                                          local_10,(int)local_8);
                if (iVar1 == 0) {
                  local_38 = 0x203;
                }
                else {
                  local_18[2] = (long)local_34 + local_18[2];
                  iVar1 = EVP_DecryptFinal_ex(local_28,(uchar *)(*local_18 + local_18[2]),&local_34)
                  ;
                  if (iVar1 == 0) {
                    local_38 = 0x203;
                  }
                  else {
                    local_18[2] = (long)local_34 + local_18[2];
                    local_38 = 0;
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  if (local_28 != (EVP_CIPHER_CTX *)0x0) {
    EVP_CIPHER_CTX_free(local_28);
  }
  if (local_30 != (HMAC_CTX *)0x0) {
    HMAC_CTX_free(local_30);
  }
  return local_38;
}

Assistant:

int ptls_openssl_decrypt_ticket(ptls_buffer_t *buf, ptls_iovec_t src,
                                int (*cb)(unsigned char *key_name, unsigned char *iv, EVP_CIPHER_CTX *ctx, HMAC_CTX *hctx, int enc))
{
    EVP_CIPHER_CTX *cctx = NULL;
    HMAC_CTX *hctx = NULL;
    int clen, ret;

    if ((cctx = EVP_CIPHER_CTX_new()) == NULL) {
        ret = PTLS_ERROR_NO_MEMORY;
        goto Exit;
    }
    if ((hctx = HMAC_CTX_new()) == NULL) {
        ret = PTLS_ERROR_NO_MEMORY;
        goto Exit;
    }

    /* obtain cipher and hash context.
     * Note: no need to handle renew, since in picotls we always send a new ticket to minimize the chance of ticket reuse */
    if (src.len < TICKET_LABEL_SIZE + TICKET_IV_SIZE) {
        ret = PTLS_ALERT_DECODE_ERROR;
        goto Exit;
    }
    if (!(*cb)(src.base, src.base + TICKET_LABEL_SIZE, cctx, hctx, 0)) {
        ret = PTLS_ERROR_LIBRARY;
        goto Exit;
    }

    /* check hmac, and exclude label, iv, hmac */
    size_t hmac_size = HMAC_size(hctx);
    if (src.len < TICKET_LABEL_SIZE + TICKET_IV_SIZE + hmac_size) {
        ret = PTLS_ALERT_DECODE_ERROR;
        goto Exit;
    }
    src.len -= hmac_size;
    uint8_t hmac[EVP_MAX_MD_SIZE];
    if (!HMAC_Update(hctx, src.base, src.len) || !HMAC_Final(hctx, hmac, NULL)) {
        ret = PTLS_ERROR_LIBRARY;
        goto Exit;
    }
    if (!ptls_mem_equal(src.base + src.len, hmac, hmac_size)) {
        ret = PTLS_ALERT_HANDSHAKE_FAILURE;
        goto Exit;
    }
    src.base += TICKET_LABEL_SIZE + TICKET_IV_SIZE;
    src.len -= TICKET_LABEL_SIZE + TICKET_IV_SIZE;

    /* decrypt */
    if ((ret = ptls_buffer_reserve(buf, src.len)) != 0)
        goto Exit;
    if (!EVP_DecryptUpdate(cctx, buf->base + buf->off, &clen, src.base, (int)src.len)) {
        ret = PTLS_ERROR_LIBRARY;
        goto Exit;
    }
    buf->off += clen;
    if (!EVP_DecryptFinal_ex(cctx, buf->base + buf->off, &clen)) {
        ret = PTLS_ERROR_LIBRARY;
        goto Exit;
    }
    buf->off += clen;

    ret = 0;

Exit:
    if (cctx != NULL)
        EVP_CIPHER_CTX_free(cctx);
    if (hctx != NULL)
        HMAC_CTX_free(hctx);
    return ret;
}